

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::Hinge::backward_impl
          (Hinge *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  long lVar2;
  uint uVar3;
  Scalar *pSVar4;
  long in_RCX;
  long in_RDX;
  DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
  *in_RDI;
  int in_R8D;
  Dim *in_R9;
  float fVar5;
  uint i_1;
  uint tne;
  float *eloss;
  uint rows;
  float d;
  undefined4 in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  Tensor *in_stack_ffffffffffffff88;
  uint local_48;
  uint local_44;
  
  if (in_R8D != 0) {
    __assert_fail("i == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                  ,0x4ea,
                  "virtual void cnn::Hinge::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  if ((**(float **)(in_RDX + 0x28) != 0.0) || (NAN(**(float **)(in_RDX + 0x28)))) {
    fVar1 = **(float **)(in_RCX + 0x28);
    uVar3 = Dim::rows(in_R9);
    lVar2 = *(long *)(in_RDI + 0x48);
    local_44 = 0;
    for (local_48 = 0; local_48 < uVar3; local_48 = local_48 + 1) {
      if (0.0 < *(float *)(lVar2 + (ulong)local_48 * 4)) {
        in_stack_ffffffffffffff6c = fVar1;
        Tensor::operator*(in_stack_ffffffffffffff88);
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 ::operator()(in_RDI,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        *pSVar4 = in_stack_ffffffffffffff6c + *pSVar4;
        local_44 = local_44 + 1;
      }
    }
    fVar5 = (float)local_44;
    Tensor::operator*(in_stack_ffffffffffffff88);
    pSVar4 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()(in_RDI,CONCAT44(in_stack_ffffffffffffff6c,fVar5));
    *pSVar4 = -fVar1 * fVar5 + *pSVar4;
  }
  return;
}

Assistant:

void Hinge::backward_impl(const vector<const Tensor*>& xs,
                       const Tensor& fx,
                       const Tensor& dEdf,
                       unsigned i,
                       Tensor& dEdxi) const {
  assert(i == 0);
#ifdef HAVE_CUDA
  throw std::runtime_error("Hinge not yet implemented for CUDA");
#else
  if (fx.v[0]) { // there was some loss
    const float d = dEdf.v[0];
    const unsigned rows = dEdxi.d.rows();
    const float* eloss = static_cast<const float*>(aux_mem);
    unsigned tne = 0;  // total number of errors
    for (unsigned i = 0; i < rows; ++i)
      if (eloss[i] > 0) {
        (*dEdxi)(i) += d;
        ++tne;
      }
    (*dEdxi)(*pelement) -= d * tne;
  }
#endif
}